

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O0

void __thiscall zmq::thread_ctx_t::thread_ctx_t(thread_ctx_t *this)

{
  long in_RDI;
  
  mutex_t::mutex_t(&this->_opt_sync);
  *(undefined4 *)(in_RDI + 0x30) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x34) = 0xffffffff;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1d3cc4);
  std::__cxx11::string::string((string *)(in_RDI + 0x68));
  return;
}

Assistant:

zmq::thread_ctx_t::thread_ctx_t () :
    _thread_priority (ZMQ_THREAD_PRIORITY_DFLT),
    _thread_sched_policy (ZMQ_THREAD_SCHED_POLICY_DFLT)
{
}